

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstr.cpp
# Opt level: O0

LPWSTR lstrcatW(LPWSTR lpString1,LPCWSTR lpString2)

{
  LPWSTR lpStart;
  LPCWSTR lpString2_local;
  LPWSTR lpString1_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (lpString1 == (LPWSTR)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    lpString1_local = (LPWSTR)0x0;
  }
  else {
    lpString2_local = lpString1;
    if (lpString2 == (LPCWSTR)0x0) {
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
      lpString1_local = (LPWSTR)0x0;
    }
    else {
      for (; lpStart = lpString2, *lpString2_local != L'\0'; lpString2_local = lpString2_local + 1)
      {
      }
      while (*lpStart != L'\0') {
        *lpString2_local = *lpStart;
        lpStart = lpStart + 1;
        lpString2_local = lpString2_local + 1;
      }
      *lpString2_local = L'\0';
      lpString1_local = lpString1;
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
  }
  return lpString1_local;
}

Assistant:

LPWSTR
PALAPI
lstrcatW(
	 IN OUT LPWSTR lpString1,
	 IN LPCWSTR lpString2)
{
    LPWSTR lpStart = lpString1;

    PERF_ENTRY(lstrcatW);
    ENTRY("lstrcatW (lpString1=%p (%S), lpString2=%p (%S))\n",
          lpString1?lpString1:W16_NULLSTRING,
          lpString1?lpString1:W16_NULLSTRING, lpString2?lpString2:W16_NULLSTRING, lpString2?lpString2:W16_NULLSTRING);

    if (lpString1 == NULL)
    {
        ERROR("invalid lpString1 argument\n");
        LOGEXIT("lstrcatW returning LPWSTR NULL\n");
        PERF_EXIT(lstrcatW);
        return NULL;
    }

    if (lpString2 == NULL)
    {
        ERROR("invalid lpString2 argument\n");
        LOGEXIT("lstrcatW returning LPWSTR NULL\n");
        PERF_EXIT(lstrcatW);
        return NULL;
    }

    /* find end of source string */
    while (*lpString1)
    {
        lpString1++;
    }

    /* concatenate new string */
    while(*lpString2)
    {
        *lpString1++ = *lpString2++;
    }

    /* add terminating null */
    *lpString1 = '\0';

    LOGEXIT("lstrcatW returning LPWSTR %p (%S)\n", lpStart, lpStart);
    PERF_EXIT(lstrcatW);
    return lpStart;
}